

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O3

int CheckCompress(size_t expectedLength)

{
  FILE *__stream;
  
  __stream = fopen("out.txt","rb");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    TestN = TestN + 1;
  }
  else {
    if ((uchar *)(expectedLength + 1) < Input + 0x1ef8c92) {
      LabOutputLength = fread(LabOutput,1,(size_t)(expectedLength + 1),__stream);
      fclose(__stream);
      if ((int)expectedLength < (int)LabOutputLength) {
        printf("output is too long, got %d bytes, expect at most %d bytes -- ",
               LabOutputLength & 0xffffffff,expectedLength & 0xffffffff);
        puts("FAILED");
        TestN = TestN + 1;
        return 1;
      }
      puts("PASSED");
      TestN = TestN + 1;
      return 0;
    }
    printf("Tester error: expected output is too large");
  }
  return -1;
}

Assistant:

static int CheckCompress(size_t expectedLength) {
    FILE *const out = fopen("out.txt", "rb");
    if (!out) {
        printf("can't open out.txt\n");
        TestN++;
        return -1;
    }
    if (expectedLength+1 > sizeof(LabOutput)) {
        printf("Tester error: expected output is too large");
        return -1;
    }
    LabOutputLength = fread(LabOutput, 1, expectedLength+1, out);
    fclose(out);
    if (CheckAtMost(LabOutputLength, expectedLength)) {
        printf("PASSED\n");
        TestN++;
        return 0;
    } else {
        printf("FAILED\n");
        TestN++;
        return 1;
    }
}